

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ossadmin_test.cc
# Opt level: O0

int test_put_bucket_limit(void)

{
  code *pcVar1;
  char *__s;
  OssAdminPutBucketLimitRequestType *pOVar2;
  HttpTestListener *pHVar3;
  allocator<char> local_1b1;
  int ret;
  HttpTestListener *local_190;
  HttpTestListener *listener;
  string local_180;
  allocator<char> local_159;
  string local_158 [39];
  allocator<char> local_131;
  string local_130 [55];
  allocator<char> local_f9;
  string local_f8 [32];
  OssAdminPutBucketLimitRequestType *local_d8;
  OssAdmin *ossadmin;
  OssAdminPutBucketLimitResponseType resp;
  OssAdminPutBucketLimitRequestType req;
  
  aliyun::OssAdminPutBucketLimitRequestType::OssAdminPutBucketLimitRequestType
            ((OssAdminPutBucketLimitRequestType *)&resp.success);
  aliyun::OssAdminPutBucketLimitResponseType::OssAdminPutBucketLimitResponseType
            ((OssAdminPutBucketLimitResponseType *)&ossadmin);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_f8,"cn-hangzhou",&local_f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_130,"my_appid",&local_131);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_158,"my_secret",&local_159);
  pOVar2 = (OssAdminPutBucketLimitRequestType *)
           aliyun::OssAdmin::CreateOssAdminClient(local_f8,local_130,local_158);
  std::__cxx11::string::~string(local_158);
  std::allocator<char>::~allocator(&local_159);
  std::__cxx11::string::~string(local_130);
  std::allocator<char>::~allocator(&local_131);
  std::__cxx11::string::~string(local_f8);
  std::allocator<char>::~allocator(&local_f9);
  local_d8 = pOVar2;
  if (pOVar2 == (OssAdminPutBucketLimitRequestType *)0x0) {
    aliyun::OssAdminPutBucketLimitResponseType::~OssAdminPutBucketLimitResponseType
              ((OssAdminPutBucketLimitResponseType *)&ossadmin);
    aliyun::OssAdminPutBucketLimitRequestType::~OssAdminPutBucketLimitRequestType
              ((OssAdminPutBucketLimitRequestType *)&resp.success);
    return 0;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_180,"127.0.0.1:12234",(allocator<char> *)((long)&listener + 7));
  aliyun::OssAdmin::SetProxyHost((OssAdmin *)pOVar2,&local_180);
  std::__cxx11::string::~string((string *)&local_180);
  std::allocator<char>::~allocator((allocator<char> *)((long)&listener + 7));
  aliyun::OssAdmin::SetUseTls((OssAdmin *)local_d8,false);
  pHVar3 = (HttpTestListener *)operator_new(0x180);
  HttpTestListener::HttpTestListener(pHVar3,0x2fca);
  __s = test_put_bucket_limit_response;
  local_190 = pHVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&ret,__s,&local_1b1);
  HttpTestListener::SetResponseBody(pHVar3,(string *)&ret);
  std::__cxx11::string::~string((string *)&ret);
  std::allocator<char>::~allocator(&local_1b1);
  HttpTestListener::Start(local_190);
  std::__cxx11::string::operator=((string *)&resp.success,"uid");
  std::__cxx11::string::operator=((string *)(req.uid.field_2._M_local_buf + 8),"bid");
  std::__cxx11::string::operator=((string *)(req.bid.field_2._M_local_buf + 8),"BucketLimit");
  std::__cxx11::string::operator=
            ((string *)(req.bucket_limit.field_2._M_local_buf + 8),"OwnerAccount");
  aliyun::OssAdmin::PutBucketLimit
            (local_d8,(OssAdminPutBucketLimitResponseType *)&resp.success,
             (OssAdminErrorInfo *)&ossadmin);
  HttpTestListener::WaitComplete(local_190);
  pHVar3 = local_190;
  if (local_190 != (HttpTestListener *)0x0) {
    HttpTestListener::~HttpTestListener(local_190);
    operator_delete(pHVar3,0x180);
  }
  pOVar2 = local_d8;
  if (local_d8 != (OssAdminPutBucketLimitRequestType *)0x0) {
    aliyun::OssAdmin::~OssAdmin((OssAdmin *)local_d8);
    operator_delete(pOVar2,0x38);
  }
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

static int test_put_bucket_limit() {
  OssAdminPutBucketLimitRequestType req;
  OssAdminPutBucketLimitResponseType resp;
  OssAdmin* ossadmin = OssAdmin::CreateOssAdminClient("cn-hangzhou", "my_appid", "my_secret");
  if(!ossadmin) return 0;
  ossadmin->SetProxyHost("127.0.0.1:12234");
  ossadmin->SetUseTls(false);
  HttpTestListener* listener = new HttpTestListener(12234);
  listener->SetResponseBody(test_put_bucket_limit_response);
  listener->Start();
  req.uid = "uid";
  req.bid = "bid";
  req.bucket_limit = "BucketLimit";
  req.owner_account = "OwnerAccount";
  int ret = ossadmin->PutBucketLimit(req, &resp, NULL);
  listener->WaitComplete();
  delete listener;
  delete ossadmin;
}